

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeEncoder::EncodeValues
          (SequentialAttributeEncoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,EncoderBuffer *out_buffer)

{
  pointer pIVar1;
  PointAttribute *pPVar2;
  size_t __n;
  uchar *__dest;
  uint uVar3;
  uint uVar4;
  ulong data_size;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> value_data_ptr;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  data_size = (ulong)(int)(this->attribute_->super_GeometryAttribute).byte_stride_;
  __dest = (uchar *)operator_new__(data_size);
  uVar4 = 0;
  local_38._M_head_impl = __dest;
  while( true ) {
    pIVar1 = (point_ids->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(point_ids->
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 2) <=
        (ulong)uVar4) break;
    pPVar2 = this->attribute_;
    uVar3 = pIVar1[uVar4].value_;
    if (pPVar2->identity_mapping_ == false) {
      uVar3 = (pPVar2->indices_map_).vector_.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
    }
    __n = (pPVar2->super_GeometryAttribute).byte_stride_;
    memcpy(__dest,(void *)((long)(((pPVar2->super_GeometryAttribute).buffer_)->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                           (pPVar2->super_GeometryAttribute).byte_offset_ + uVar3 * __n),__n);
    EncoderBuffer::Encode(out_buffer,__dest,data_size);
    uVar4 = uVar4 + 1;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
  return true;
}

Assistant:

bool SequentialAttributeEncoder::EncodeValues(
    const std::vector<PointIndex> &point_ids, EncoderBuffer *out_buffer) {
  const int entry_size = static_cast<int>(attribute_->byte_stride());
  const std::unique_ptr<uint8_t[]> value_data_ptr(new uint8_t[entry_size]);
  uint8_t *const value_data = value_data_ptr.get();
  // Encode all attribute values in their native raw format.
  for (uint32_t i = 0; i < point_ids.size(); ++i) {
    const AttributeValueIndex entry_id = attribute_->mapped_index(point_ids[i]);
    attribute_->GetValue(entry_id, value_data);
    out_buffer->Encode(value_data, entry_size);
  }
  return true;
}